

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eglwLibrary.cpp
# Opt level: O2

char * eglw::DefaultLibrary::getLibraryFileName(void)

{
  return "libEGL.so";
}

Assistant:

const char* DefaultLibrary::getLibraryFileName (void)
{
#if (DE_OS == DE_OS_ANDROID) || (DE_OS == DE_OS_UNIX)
	return "libEGL.so";
#elif (DE_OS == DE_OS_WIN32)
	return "libEGL.dll";
#else
	return DE_NULL;
#endif
}